

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

STBase * __thiscall jbcoin::STObject::getField(STObject *this,SField *field)

{
  int iVar1;
  
  iVar1 = getFieldIndex(this,field);
  if (iVar1 != -1) {
    return (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start[iVar1].p_;
  }
  Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
}

Assistant:

STBase& STObject::getField (SField const& field)
{
    int index = getFieldIndex (field);

    if (index == -1)
        Throw<std::runtime_error> ("Field not found");

    return getIndex (index);
}